

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

bool crnlib::rg_etc1::unpack_etc2_alpha(void *pBlock,uint *pDst_pixels_rgba,int comp_index)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  sbyte sVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint d0;
  int iVar10;
  uint i;
  int iVar11;
  int iVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 auStack_10 [2];
  uint8 values [8];
  
  bVar1 = *(byte *)((long)pBlock + 1);
  uVar7 = (uint)*pBlock;
  lVar8 = 0;
  do {
    auVar15 = *(undefined1 (*) [16])
               (g_etc2a_modifier_table + lVar8 * 4 + (ulong)((bVar1 & 0xf) << 5));
    auVar14._0_4_ = auVar15._0_4_ * (uint)(bVar1 >> 4) + uVar7;
    auVar14._4_4_ = auVar15._4_4_ * (uint)(bVar1 >> 4) + uVar7;
    auVar14._8_4_ = (int)((auVar15._8_8_ & 0xffffffff) * (ulong)(bVar1 >> 4)) + uVar7;
    auVar14._12_4_ = auVar15._12_4_ * (uint)(bVar1 >> 4) + uVar7;
    auVar15 = packssdw(auVar14,auVar14);
    sVar2 = auVar15._0_2_;
    sVar3 = auVar15._2_2_;
    sVar4 = auVar15._4_2_;
    sVar5 = auVar15._6_2_;
    *(uint *)((long)auStack_10 + lVar8) =
         CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar15[6] - (0xff < sVar5),
                  CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar15[4] - (0xff < sVar4),
                           CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar15[2] - (0xff < sVar3),
                                    (0 < sVar2) * (sVar2 < 0x100) * auVar15[0] - (0xff < sVar2))));
    lVar8 = lVar8 + 4;
  } while (lVar8 != 8);
  iVar10 = 3;
  iVar11 = 0;
  do {
    iVar12 = 0;
    do {
      uVar9 = (ulong)((uint)(iVar10 + iVar12) >> 3);
      uVar7 = iVar10 + iVar12 & 7;
      sVar6 = (sbyte)uVar7;
      uVar13 = (uint)(*(byte *)((long)pBlock + uVar9 + 2) >> (8U - sVar6 & 0x1f));
      if (uVar7 < 3) {
        uVar13 = (uint)*(byte *)((long)pBlock + uVar9 + 1) << sVar6 | uVar13;
      }
      *(undefined1 *)((long)pDst_pixels_rgba + (long)comp_index) =
           *(undefined1 *)((long)auStack_10 + (ulong)(uVar13 & 7));
      pDst_pixels_rgba = pDst_pixels_rgba + 1;
      iVar12 = iVar12 + 0xc;
    } while (iVar12 != 0x30);
    iVar11 = iVar11 + 1;
    iVar10 = iVar10 + 3;
  } while (iVar11 != 4);
  return true;
}

Assistant:

bool unpack_etc2_alpha(const void* pBlock, unsigned int* pDst_pixels_rgba, int comp_index)
        {
            color_quad_u8* pDst = (color_quad_u8*)pDst_pixels_rgba;
            const uint8* B = (const uint8*)pBlock;
            const int* modifier = g_etc2a_modifier_table[B[1] & 0xF];
            uint8 values[8];
            for (int base_codeword = B[0], multiplier = B[1] >> 4, i = 0; i < 8; i++)
            {
                values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
            }
            for (uint d0 = 3, i = 0; i < 4; i++, d0 += 3)
            {
                for (uint d = d0, j = 0; j < 4; j++, pDst++, d += 12)
                {
                    int byte_offset = 2 + (d >> 3);
                    int bit_offset = d & 7;
                    int s = B[byte_offset] >> (8 - bit_offset) & 7;
                    if (bit_offset < 3)
                    {
                        s |= B[byte_offset - 1] << bit_offset & 7;
                    }
                    pDst->c[comp_index] = values[s];
                }
            }
            return true;
        }